

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

us_internal_ssl_socket_context_t *
us_internal_create_ssl_socket_context
          (us_loop_t *loop,int context_ext_size,us_socket_context_options_t options)

{
  int iVar1;
  us_internal_ssl_socket_context_t *puVar2;
  SSL_METHOD *meth;
  SSL_CTX *ctx;
  stack_st_X509_NAME *name_list;
  FILE *fp;
  DH *parg;
  long lVar3;
  us_socket_context_options_t no_options;
  
  us_internal_init_loop_ssl_data(loop);
  puVar2 = (us_internal_ssl_socket_context_t *)
           us_create_socket_context
                     (0,loop,context_ext_size + 0xc0,
                      (us_socket_context_options_t)ZEXT1648(ZEXT816(0)));
  meth = (SSL_METHOD *)TLS_method();
  ctx = SSL_CTX_new(meth);
  puVar2->ssl_context = (SSL_CTX *)ctx;
  puVar2->is_parent = 1;
  (puVar2->sc).ignore_data = ssl_ignore_data;
  SSL_CTX_ctrl(ctx,0x29,1,(void *)0x0);
  SSL_CTX_ctrl((SSL_CTX *)puVar2->ssl_context,0x21,2,(void *)0x0);
  if (options.ssl_prefer_low_memory_usage != 0) {
    SSL_CTX_ctrl((SSL_CTX *)puVar2->ssl_context,0x21,0x10,(void *)0x0);
  }
  SSL_CTX_set_options(puVar2->ssl_context,0x2000000);
  SSL_CTX_set_options(puVar2->ssl_context,0x4000000);
  if (options.passphrase != (char *)0x0) {
    SSL_CTX_set_default_passwd_cb_userdata((SSL_CTX *)puVar2->ssl_context,options.passphrase);
    SSL_CTX_set_default_passwd_cb((SSL_CTX *)puVar2->ssl_context,passphrase_cb);
  }
  if (((options.cert_file_name == (char *)0x0) ||
      (iVar1 = SSL_CTX_use_certificate_chain_file
                         ((SSL_CTX *)puVar2->ssl_context,options.cert_file_name), iVar1 == 1)) &&
     ((options.key_file_name == (char *)0x0 ||
      (iVar1 = SSL_CTX_use_PrivateKey_file((SSL_CTX *)puVar2->ssl_context,options.key_file_name,1),
      iVar1 == 1)))) {
    if (options.ca_file_name != (char *)0x0) {
      name_list = SSL_load_client_CA_file(options.ca_file_name);
      if (name_list == (stack_st_X509_NAME *)0x0) {
        return (us_internal_ssl_socket_context_t *)0x0;
      }
      SSL_CTX_set_client_CA_list((SSL_CTX *)puVar2->ssl_context,name_list);
      iVar1 = SSL_CTX_load_verify_locations
                        ((SSL_CTX *)puVar2->ssl_context,options.ca_file_name,(char *)0x0);
      if (iVar1 != 1) {
        return (us_internal_ssl_socket_context_t *)0x0;
      }
      SSL_CTX_set_verify((SSL_CTX *)puVar2->ssl_context,1,(callback *)0x0);
    }
    if (options.dh_params_file_name == (char *)0x0) {
      return puVar2;
    }
    fp = fopen(options.dh_params_file_name,"r");
    if (fp != (FILE *)0x0) {
      parg = PEM_read_DHparams(fp,(DH **)0x0,(undefined1 *)0x0,(void *)0x0);
      fclose(fp);
      if (parg == (DH *)0x0) {
        return (us_internal_ssl_socket_context_t *)0x0;
      }
      lVar3 = SSL_CTX_ctrl((SSL_CTX *)puVar2->ssl_context,3,0,parg);
      if (lVar3 != 1) {
        return (us_internal_ssl_socket_context_t *)0x0;
      }
      iVar1 = SSL_CTX_set_cipher_list
                        ((SSL_CTX *)puVar2->ssl_context,
                         "DHE-RSA-AES256-GCM-SHA384:DHE-RSA-AES128-GCM-SHA256:ECDHE-RSA-AES256-GCM-SHA384:ECDHE-RSA-AES128-GCM-SHA256"
                        );
      if (iVar1 == 1) {
        return puVar2;
      }
    }
  }
  return (us_internal_ssl_socket_context_t *)0x0;
}

Assistant:

struct us_internal_ssl_socket_context_t *us_internal_create_ssl_socket_context(struct us_loop_t *loop, int context_ext_size, struct us_socket_context_options_t options) {

    us_internal_init_loop_ssl_data(loop);

    struct us_socket_context_options_t no_options = {0};

    struct us_internal_ssl_socket_context_t *context = (struct us_internal_ssl_socket_context_t *) us_create_socket_context(0, loop, sizeof(struct us_internal_ssl_socket_context_t) + context_ext_size, no_options);

    context->ssl_context = SSL_CTX_new(TLS_method());
    context->is_parent = 1;
    // only parent ssl contexts may need to ignore data
    context->sc.ignore_data = (int (*)(struct us_socket_t *)) ssl_ignore_data;

    // options
    SSL_CTX_set_read_ahead(context->ssl_context, 1);
    SSL_CTX_set_mode(context->ssl_context, SSL_MODE_ACCEPT_MOVING_WRITE_BUFFER);
    //SSL_CTX_set_mode(context->ssl_context, SSL_MODE_ENABLE_PARTIAL_WRITE);

    // this lowers performance a bit in benchmarks
    if (options.ssl_prefer_low_memory_usage) {
       SSL_CTX_set_mode(context->ssl_context, SSL_MODE_RELEASE_BUFFERS);
    }

    //SSL_CTX_set_mode(context->ssl_context, SSL_MODE_RELEASE_BUFFERS);
    SSL_CTX_set_options(context->ssl_context, SSL_OP_NO_SSLv3);
    SSL_CTX_set_options(context->ssl_context, SSL_OP_NO_TLSv1);

    // these are going to be extended
    if (options.passphrase) {
        SSL_CTX_set_default_passwd_cb_userdata(context->ssl_context, (void *) options.passphrase);
        SSL_CTX_set_default_passwd_cb(context->ssl_context, passphrase_cb);
    }

    if (options.cert_file_name) {
        if (SSL_CTX_use_certificate_chain_file(context->ssl_context, options.cert_file_name) != 1) {
            return 0;
        }
    }

    if (options.key_file_name) {
        if (SSL_CTX_use_PrivateKey_file(context->ssl_context, options.key_file_name, SSL_FILETYPE_PEM) != 1) {
            return 0;
        }
    }

    if (options.ca_file_name) {
        STACK_OF(X509_NAME) *ca_list;
        ca_list = SSL_load_client_CA_file(options.ca_file_name);
        if(ca_list == NULL) {
            return 0;
        }
        SSL_CTX_set_client_CA_list(context->ssl_context, ca_list);
        if (SSL_CTX_load_verify_locations(context->ssl_context, options.ca_file_name, NULL) != 1) {
            return 0;
        }
        SSL_CTX_set_verify(context->ssl_context, SSL_VERIFY_PEER, NULL);
    }

    if (options.dh_params_file_name) {
        /* Set up ephemeral DH parameters. */
        DH *dh_2048 = NULL;
        FILE *paramfile;
        paramfile = fopen(options.dh_params_file_name, "r");

        if (paramfile) {
            dh_2048 = PEM_read_DHparams(paramfile, NULL, NULL, NULL);
            fclose(paramfile);
        } else {
            return 0;
        }

        if (dh_2048 == NULL) {
            return 0;
        }

        if (SSL_CTX_set_tmp_dh(context->ssl_context, dh_2048) != 1) {
            return 0;
        }

        /* OWASP Cipher String 'A+' (https://www.owasp.org/index.php/TLS_Cipher_String_Cheat_Sheet) */
        if (SSL_CTX_set_cipher_list(context->ssl_context, "DHE-RSA-AES256-GCM-SHA384:DHE-RSA-AES128-GCM-SHA256:ECDHE-RSA-AES256-GCM-SHA384:ECDHE-RSA-AES128-GCM-SHA256") != 1) {
            return 0;
        }
    }

    return context;
}